

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateFastArgumentsLdElemI(Lowerer *this,Instr *ldElem,LabelInstr *labelFallThru)

{
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  undefined4 *puVar4;
  Opnd *pOVar5;
  RegOpnd *indexOpnd_00;
  Opnd *pOVar6;
  LabelInstr *notTaggedIntLabel;
  Instr *this_00;
  RejitException *this_01;
  Opnd *undef_1;
  Opnd *argIndirOpnd;
  Instr *loadInputParamCountInstr;
  LabelInstr *labelReturnUndefined;
  Opnd *undef;
  IntConstOpnd *pIStack_68;
  bool hasIntConstIndex;
  Opnd *actualParamOpnd;
  Opnd *valueOpnd;
  RegOpnd *indexOpnd;
  IntConstType value;
  bool isNotInt;
  LabelInstr *pLStack_40;
  bool emittedFastPath;
  LabelInstr *labelCreateHeapArgs;
  Func *func;
  IndirOpnd *pIStack_28;
  bool isInlinee;
  IndirOpnd *indirOpnd;
  LabelInstr *labelFallThru_local;
  Instr *ldElem_local;
  Lowerer *this_local;
  
  indirOpnd = (IndirOpnd *)labelFallThru;
  labelFallThru_local = (LabelInstr *)ldElem;
  ldElem_local = (Instr *)this;
  bVar2 = IR::Instr::DoStackArgsOpt(ldElem);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5697,"(ldElem->DoStackArgsOpt())","ldElem->DoStackArgsOpt()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOVar5 = IR::Instr::GetSrc1(&labelFallThru_local->super_Instr);
  pIStack_28 = IR::Opnd::AsIndirOpnd(pOVar5);
  func._7_1_ = Func::IsInlinee((labelFallThru_local->super_Instr).m_func);
  labelCreateHeapArgs = (LabelInstr *)(labelFallThru_local->super_Instr).m_func;
  pLStack_40 = IR::LabelInstr::New(Label,(Func *)labelCreateHeapArgs,true);
  value._7_1_ = 0;
  value._6_1_ = 0;
  indexOpnd = (RegOpnd *)0x0;
  indexOpnd_00 = IR::IndirOpnd::GetIndexOpnd(pIStack_28);
  bVar2 = IR::IndirOpnd::TryGetIntConstIndexValue
                    (pIStack_28,true,(IntConstType *)&indexOpnd,(bool *)((long)&value + 6));
  if ((value._6_1_ & 1) == 0) {
    if ((bVar2) &&
       (((long)indexOpnd < 0 ||
        (((func._7_1_ & 1) != 0 &&
         ((long)(int)(((labelFallThru_local->super_Instr).m_func)->actualCount - 1) <=
          (long)indexOpnd)))))) {
      pOVar5 = LoadLibraryValueOpnd(this,&labelFallThru_local->super_Instr,ValueUndefined);
      pOVar6 = IR::Instr::GetDst(&labelFallThru_local->super_Instr);
      InsertMove(pOVar6,pOVar5,&labelFallThru_local->super_Instr,true);
      InsertBranch(Br,(LabelInstr *)indirOpnd,&labelFallThru_local->super_Instr);
      value._7_1_ = 1;
    }
    else if (indirOpnd != (IndirOpnd *)0x0) {
      notTaggedIntLabel = IR::LabelInstr::New(Label,(Func *)labelCreateHeapArgs,true);
      if ((func._7_1_ & 1) == 0) {
        this_00 = LowererMD::LoadInputParamCount
                            (&this->m_lowererMD,&labelFallThru_local->super_Instr,-1,false);
        pOVar5 = IR::Instr::GetDst(this_00);
        pIStack_68 = (IntConstOpnd *)IR::Opnd::UseWithNewType(pOVar5,TyInt32,this->m_func);
      }
      else {
        pIStack_68 = IR::IntConstOpnd::New
                               ((long)(int)(((labelFallThru_local->super_Instr).m_func)->actualCount
                                           - 1),TyInt32,(Func *)labelCreateHeapArgs,false);
      }
      if (bVar2) {
        actualParamOpnd =
             &IR::IntConstOpnd::New
                        ((IntConstType)indexOpnd,TyInt32,(Func *)labelCreateHeapArgs,false)->
              super_Opnd;
      }
      else {
        IVar3 = IR::Opnd::GetType(&indexOpnd_00->super_Opnd);
        actualParamOpnd =
             &LowererMD::LoadNonnegativeIndex
                        (&this->m_lowererMD,indexOpnd_00,IVar3 == TyUint32,notTaggedIntLabel,
                         notTaggedIntLabel,&labelFallThru_local->super_Instr)->super_Opnd;
      }
      if ((func._7_1_ & 1) == 0) {
        GenerateCheckForArgumentsLength
                  (this,&labelFallThru_local->super_Instr,notTaggedIntLabel,&pIStack_68->super_Opnd,
                   actualParamOpnd,BrLe_A);
      }
      else if (!bVar2) {
        GenerateCheckForArgumentsLength
                  (this,&labelFallThru_local->super_Instr,notTaggedIntLabel,actualParamOpnd,
                   &pIStack_68->super_Opnd,BrGe_A);
      }
      if ((func._7_1_ & 1) == 0) {
        undef_1 = &GetArgsIndirOpndForTopFunction
                             (this,&labelFallThru_local->super_Instr,actualParamOpnd)->super_Opnd;
      }
      else {
        undef_1 = &GetArgsIndirOpndForInlinee
                             (this,&labelFallThru_local->super_Instr,actualParamOpnd)->super_Opnd;
      }
      pOVar5 = IR::Instr::GetDst(&labelFallThru_local->super_Instr);
      InsertMove(pOVar5,undef_1,&labelFallThru_local->super_Instr,true);
      InsertBranch(Br,(LabelInstr *)indirOpnd,&labelFallThru_local->super_Instr);
      IR::Instr::InsertBefore(&labelFallThru_local->super_Instr,&notTaggedIntLabel->super_Instr);
      pOVar5 = LoadLibraryValueOpnd(this,&labelFallThru_local->super_Instr,ValueUndefined);
      pOVar6 = IR::Instr::GetDst(&labelFallThru_local->super_Instr);
      InsertMove(pOVar6,pOVar5,&labelFallThru_local->super_Instr,true);
      InsertBranch(Br,(LabelInstr *)indirOpnd,&labelFallThru_local->super_Instr);
      IR::Instr::InsertBefore(&labelFallThru_local->super_Instr,&pLStack_40->super_Instr);
      value._7_1_ = 1;
    }
  }
  if ((value._7_1_ & 1) != 0) {
    return (bool)(value._7_1_ & 1);
  }
  this_01 = (RejitException *)__cxa_allocate_exception(1);
  Js::RejitException::RejitException(this_01,DisableStackArgOpt);
  __cxa_throw(this_01,&Js::RejitException::typeinfo,0);
}

Assistant:

bool
Lowerer::GenerateFastArgumentsLdElemI(IR::Instr* ldElem, IR::LabelInstr *labelFallThru)
{
    //  ---GenerateSmIntTest
    //  ---GenerateLdValueFromCheckedIndexOpnd
    //  ---LoadInputParamCount
    //  CMP actualParamOpnd, valueOpnd //Compare between the actual count & the index count (say i in arguments[i])
    //  JLE $labelReturnUndefined
    //  MOV dst, ebp [(valueOpnd + 5) *4]  // 5 for the stack layout
    //  JMP $fallthrough
    //
    //labelReturnUndefined:
    //  MOV dst, undefined
    //  JMP $fallthrough
    //
    //labelCreateHeapArgs:
    //  ---Bail out to create Heap Arguments object

    Assert(ldElem->DoStackArgsOpt());

    IR::IndirOpnd *indirOpnd = ldElem->GetSrc1()->AsIndirOpnd();
    bool isInlinee = ldElem->m_func->IsInlinee();
    Func *func = ldElem->m_func;

    IR::LabelInstr *labelCreateHeapArgs = IR::LabelInstr::New(Js::OpCode::Label, func, true);

    // Now load the index and check if it is an integer.
    bool emittedFastPath = false;
    bool isNotInt = false;
    IntConstType   value = 0;
    IR::RegOpnd   *indexOpnd = indirOpnd->GetIndexOpnd();
    IR::Opnd      *valueOpnd = nullptr;
    IR::Opnd      *actualParamOpnd = nullptr;

    bool hasIntConstIndex = indirOpnd->TryGetIntConstIndexValue(true, &value, &isNotInt);

    if (isNotInt)
    {
        //Not an int disable optimisation and rejit
    }
    else if (hasIntConstIndex && (value < 0 || (isInlinee && value >= (ldElem->m_func->actualCount - 1))))
    {
        // if the index is an int const outside the range then the value must be undefined
        // this is ensured as GlobOpt::OptArguments disables the Arguments optimisation if the arguments object is modified
        IR::Opnd *undef = LoadLibraryValueOpnd(ldElem, LibraryValue::ValueUndefined);
        Lowerer::InsertMove(ldElem->GetDst(), undef, ldElem);
        // JMP $done
        InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);
        emittedFastPath = true;
    }
    else if (labelFallThru != nullptr)
    {
        IR::LabelInstr *labelReturnUndefined = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        if (isInlinee)
        {
            actualParamOpnd = IR::IntConstOpnd::New(ldElem->m_func->actualCount - 1, TyInt32, func);
        }
        else
        {
            // Load actuals count, LoadHeapArguments will reuse the generated instructions here
            IR::Instr      *loadInputParamCountInstr = this->m_lowererMD.LoadInputParamCount(ldElem, -1 /* don't include 'this' while counting actuals. */);
            actualParamOpnd = loadInputParamCountInstr->GetDst()->UseWithNewType(TyInt32,this->m_func);
        }

        if (hasIntConstIndex)
        {
            //Constant index
            valueOpnd = IR::IntConstOpnd::New(value, TyInt32, func);
        }
        else
        {
            //Load valueOpnd from the index, note this operation includes a bail-out for non-integer indices
            valueOpnd =
                m_lowererMD.LoadNonnegativeIndex(
                    indexOpnd,
                    (
#if INT32VAR
                        indexOpnd->GetType() == TyUint32
#else
                        // On 32-bit platforms, skip the negative check since for now, the unsigned upper bound check covers it
                        true
#endif
                        ),
                    labelReturnUndefined,
                    labelReturnUndefined,
                    ldElem);
        }

        if (isInlinee)
        {
            if (!hasIntConstIndex)
            {
                //Runtime check to make sure length is within the arguments.length range.
                GenerateCheckForArgumentsLength(ldElem, labelReturnUndefined, valueOpnd, actualParamOpnd, Js::OpCode::BrGe_A);
            }
        }
        else
        {
            GenerateCheckForArgumentsLength(ldElem, labelReturnUndefined, actualParamOpnd, valueOpnd, Js::OpCode::BrLe_A);
        }

        IR::Opnd *argIndirOpnd = nullptr;
        if (isInlinee)
        {
            argIndirOpnd = GetArgsIndirOpndForInlinee(ldElem, valueOpnd);
        }
        else
        {
            argIndirOpnd = GetArgsIndirOpndForTopFunction(ldElem, valueOpnd);
        }

        Lowerer::InsertMove(ldElem->GetDst(), argIndirOpnd, ldElem);
        // JMP $done
        InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);

        // if load is outside of range at runtime return false
        ldElem->InsertBefore(labelReturnUndefined);
        IR::Opnd *undef = LoadLibraryValueOpnd(ldElem, LibraryValue::ValueUndefined);
        Lowerer::InsertMove(ldElem->GetDst(), undef, ldElem);
        // JMP $done
        InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);

        // $labelCreateHeapArgs:
        ldElem->InsertBefore(labelCreateHeapArgs);
        emittedFastPath = true;
    }

    if (!emittedFastPath)
    {
        throw Js::RejitException(RejitReason::DisableStackArgOpt);
    }

    return emittedFastPath;
}